

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>::
     Operation<duckdb::hugeint_t,long,duckdb::ArgMinMaxState<duckdb::hugeint_t,long>,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (ArgMinMaxState<duckdb::hugeint_t,_long> *state,hugeint_t *x,long *y,
               AggregateBinaryInput *binary)

{
  int64_t iVar1;
  AggregateBinaryInput *in_R9;
  hugeint_t x_data;
  
  if ((state->super_ArgMinMaxStateBase).is_initialized != false) {
    x_data.upper = *y;
    x_data.lower = x->upper;
    Execute<duckdb::hugeint_t,long,duckdb::ArgMinMaxState<duckdb::hugeint_t,long>>
              ((ArgMinMaxBase<duckdb::GreaterThan,true> *)state,
               (ArgMinMaxState<duckdb::hugeint_t,_long> *)x->lower,x_data,(long)binary,in_R9);
    return;
  }
  TemplatedValidityMask<unsigned_long>::RowIsValid
            (&binary->left_mask->super_TemplatedValidityMask<unsigned_long>,binary->lidx);
  iVar1 = x->upper;
  (state->arg).lower = x->lower;
  (state->arg).upper = iVar1;
  state->value = *y;
  (state->super_ArgMinMaxStateBase).is_initialized = true;
  return;
}

Assistant:

static void Operation(STATE &state, const A_TYPE &x, const B_TYPE &y, AggregateBinaryInput &binary) {
		if (!state.is_initialized) {
			if (IGNORE_NULL || binary.right_mask.RowIsValid(binary.ridx)) {
				Assign(state, x, y, !binary.left_mask.RowIsValid(binary.lidx));
				state.is_initialized = true;
			}
		} else {
			OP::template Execute<A_TYPE, B_TYPE, STATE>(state, x, y, binary);
		}
	}